

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::ShurComplementProduct
          (ChSystemDescriptor *this,ChVectorDynamic<> *result,ChVectorDynamic<> *lvector,
          vector<bool,_std::allocator<bool>_> *enabled)

{
  pointer ppCVar1;
  ChVariables *this_00;
  ChConstraint *pCVar2;
  double *pdVar3;
  int iVar4;
  void *pvVar5;
  int iVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Index size;
  double in_XMM0_Qa;
  void *local_48;
  ulong local_40;
  
  if ((this->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("vstiffness.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x1e8,
                  "virtual void chrono::ChSystemDescriptor::ShurComplementProduct(ChVectorDynamic<> &, const ChVectorDynamic<> &, std::vector<bool> *)"
                 );
  }
  lVar12 = (lvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  iVar6 = (*this->_vptr_ChSystemDescriptor[8])();
  if (lVar12 != iVar6) {
    __assert_fail("lvector.size() == CountActiveConstraints()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x1e9,
                  "virtual void chrono::ChSystemDescriptor::ShurComplementProduct(ChVectorDynamic<> &, const ChVectorDynamic<> &, std::vector<bool> *)"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)this->n_c
            );
  lVar12 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (lVar12 < 0) {
LAB_007942b6:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar12 != 0) {
    memset((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,lVar12 << 3);
  }
  ppCVar8 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    lVar11 = 0;
    do {
      this_00 = (this->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar11];
      if (this_00->disabled == false) {
        ChVariables::Get_qb((ChVectorRef *)&local_48,this_00);
        uVar16 = local_40;
        pvVar5 = local_48;
        if ((long)local_40 < 0) goto LAB_007942b6;
        uVar15 = local_40;
        if ((((ulong)local_48 & 7) == 0) &&
           (uVar15 = (ulong)(-((uint)((ulong)local_48 >> 3) & 0x1fffffff) & 7), local_40 <= uVar15))
        {
          uVar15 = local_40;
        }
        uVar14 = local_40 - uVar15;
        uVar13 = uVar14 + 7;
        if (-1 < (long)uVar14) {
          uVar13 = uVar14;
        }
        if (uVar15 != 0) {
          memset(local_48,0,uVar15 * 8);
        }
        lVar9 = (uVar13 & 0xfffffffffffffff8) + uVar15;
        if (7 < (long)uVar14) {
          lVar10 = uVar15 + 8;
          if ((long)(uVar15 + 8) < lVar9) {
            lVar10 = lVar9;
          }
          memset((void *)((long)pvVar5 + uVar15 * 8),0,
                 (~uVar15 + lVar10 & 0xfffffffffffffff8) * 8 + 0x40);
        }
        if (lVar9 < (long)uVar16) {
          memset((void *)((long)pvVar5 + uVar15 * 8 + ((long)uVar13 >> 3) * 0x40),0,
                 ((long)uVar14 % 8) * 8);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar11);
  }
  if (ppCVar1 != ppCVar8) {
    ppCVar7 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)ppCVar1 - (long)ppCVar8 >> 3;
    lVar12 = 0;
    do {
      pCVar2 = ppCVar7[lVar12];
      if (pCVar2->active == true) {
        iVar6 = pCVar2->offset;
        uVar16 = (ulong)iVar6;
        if (enabled != (vector<bool,_std::allocator<bool>_> *)0x0) {
          iVar4 = iVar6 + 0x3f;
          if (-1 < iVar6) {
            iVar4 = iVar6;
          }
          if (((enabled->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar4 >> 6) +
                (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar16 & 0x3f) & 1) == 0) goto LAB_007941b0;
        }
        if ((iVar6 < 0) ||
           ((lvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= (long)uVar16)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        in_XMM0_Qa = (lvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[uVar16];
        (*pCVar2->_vptr_ChConstraint[8])();
        if ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= (long)uVar16) goto LAB_00794297;
        ppCVar7 = (this->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        in_XMM0_Qa = in_XMM0_Qa * ppCVar7[lVar12]->cfm_i;
        (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar16] = in_XMM0_Qa;
      }
LAB_007941b0:
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
    if (ppCVar1 != ppCVar8) {
      ppCVar8 = (this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar12 = 0;
      do {
        pCVar2 = ppCVar8[lVar12];
        if (pCVar2->active == true) {
          if (enabled != (vector<bool,_std::allocator<bool>_> *)0x0) {
            iVar6 = pCVar2->offset;
            uVar16 = (ulong)iVar6;
            iVar4 = iVar6 + 0x3f;
            if (-1 < (long)uVar16) {
              iVar4 = iVar6;
            }
            if (((enabled->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar4 >> 6) +
                  (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
                 >> (uVar16 & 0x3f) & 1) == 0) {
              if ((-1 < iVar6) &&
                 ((long)uVar16 <
                  (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                  .m_rows)) {
                (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data[uVar16] = 0.0;
                goto LAB_0079427c;
              }
LAB_00794297:
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
          }
          (*pCVar2->_vptr_ChConstraint[7])();
          ppCVar8 = (this->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = (long)ppCVar8[lVar12]->offset;
          if ((lVar9 < 0) ||
             ((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar9)) goto LAB_00794297;
          pdVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          in_XMM0_Qa = in_XMM0_Qa + pdVar3[lVar9];
          pdVar3[lVar9] = in_XMM0_Qa;
        }
LAB_0079427c:
        lVar12 = lVar12 + 1;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::ShurComplementProduct(ChVectorDynamic<>& result,
                                               const ChVectorDynamic<>& lvector,
                                               std::vector<bool>* enabled) {
    // currently, the case with ChKblock items is not supported (only diagonal M is supported, no K)
    assert(vstiffness.size() == 0);
    assert(lvector.size() == CountActiveConstraints());

    result.setZero(n_c);

    // Performs the sparse product    result = [N]*l = [ [Cq][M^(-1)][Cq'] - [E] ] *l
    // in different phases:

    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();

    // 1 - set the qb vector (aka speeds, in each ChVariable sparse data) as zero

    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive())
            vvariables[iv]->Get_qb().setZero();
    }

    // 2 - performs    qb=[M^(-1)][Cq']*l  by
    //     iterating over all constraints (when implemented in parallel this
    //     could be non-trivial because race conditions might occur -> reduction buffer etc.)
    //     Also, begin to add the cfm term ( -[E]*l ) to the result.

    // ATTENTION:  this loop cannot be parallelized! Concurrent write to some q may happen
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            int s_c = vconstraints[ic]->GetOffset();

            bool process = (!enabled) || (*enabled)[s_c];

            if (process) {
                double li = lvector(s_c);

                // Compute qb += [M^(-1)][Cq']*l_i
                //  NOTE! concurrent update to same q data, risk of collision if parallel.
                vconstraints[ic]->Increment_q(li);  // computationally intensive

                // Add constraint force mixing term  result = cfm * l_i = [E]*l_i
                result(s_c) = vconstraints[ic]->Get_cfm_i() * li;
            }
        }
    }

    // 3 - performs    result=[Cq']*qb    by
    //     iterating over all constraints

    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            bool process = (!enabled) || (*enabled)[vconstraints[ic]->GetOffset()];

            if (process)
                result(vconstraints[ic]->GetOffset()) += vconstraints[ic]->Compute_Cq_q();  // computationally intensive
            else
                result(vconstraints[ic]->GetOffset()) = 0;  // not enabled constraints, just set to 0 result
        }
    }
}